

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O0

int create_pipe(int *filedes,int flags)

{
  int __fd;
  int iVar1;
  uint uVar2;
  uint in_ESI;
  int *in_RDI;
  int ret;
  
  iVar1 = pipe2(in_RDI,0x80000);
  if (iVar1 != -1) {
    if ((in_ESI & 1) == 0) {
      fcntl(*in_RDI,2,0);
    }
    if ((in_ESI & 2) != 0) {
      __fd = *in_RDI;
      uVar2 = fcntl(*in_RDI,3);
      fcntl(__fd,4,(ulong)(uVar2 | 0x800));
    }
  }
  return iVar1;
}

Assistant:

static int create_pipe(int filedes[], int flags)
{
    int ret = -1;
#ifdef HAVE_PIPE2
    /* use pipe2(2) whenever possible, since it can thread-safely create a
     * cloexec pair of pipes. Without it, we have a race condition setting
     * FD_CLOEXEC
     */

#  ifdef O_NOSIGPIPE
    /* try first with O_NOSIGPIPE */
    ret = pipe2(filedes, O_CLOEXEC | O_NOSIGPIPE);
    if (ret == -1) {
        /* O_NOSIGPIPE not supported, ignore SIGPIPE */
        ignore_sigpipe();
    }
#  endif
    if (ret == -1)
        ret = pipe2(filedes, O_CLOEXEC);
    if (ret == -1)
        return ret;

    if ((flags & FFD_CLOEXEC) == 0)
        fcntl(filedes[0], F_SETFD, 0);
#else
    ret = pipe(filedes);
    if (ret == -1)
        return ret;

    fcntl(filedes[1], F_SETFD, FD_CLOEXEC);
    if (flags & FFD_CLOEXEC)
        fcntl(filedes[0], F_SETFD, FD_CLOEXEC);
#endif
    if (flags & FFD_NONBLOCK)
        fcntl(filedes[0], F_SETFL, fcntl(filedes[0], F_GETFL) | O_NONBLOCK);
    return ret;
}